

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_0::TypePrinter::print::anon_class_8_1_8991fb9c::operator()
          (anon_class_8_1_8991fb9c *this,char *prefix,Type type)

{
  TypePrinter *this_00;
  Type type_00;
  ostream *poVar1;
  size_t sVar2;
  Type *pTVar3;
  Type *pTVar4;
  Type *pTVar5;
  Type local_50;
  Type type_local;
  Iterator __begin3;
  
  this_00 = this->this;
  type_local.id._0_1_ = 0x28;
  local_50.id = type.id;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(this_00->os,(char *)&type_local,1);
  if (prefix == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(prefix);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,prefix,sVar2);
  }
  type_local.id = (uintptr_t)&local_50;
  __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  pTVar3 = (Type *)wasm::Type::size((Type *)type_local.id);
  if (pTVar3 != (Type *)0x0) {
    pTVar4 = (Type *)0x1;
    do {
      pTVar5 = pTVar4;
      pTVar4 = wasm::Type::Iterator::operator*((Iterator *)&type_local);
      type_00.id = pTVar4->id;
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index._7_1_ =
           0x20;
      std::__ostream_insert<char,std::char_traits<char>>
                (this_00->os,
                 (char *)((long)&__begin3.
                                 super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .index + 7),1);
      TypePrinter::print(this_00,type_00);
      pTVar4 = (Type *)((long)&pTVar5->id + 1);
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar5;
    } while (pTVar5 != pTVar3);
  }
  type_local.id._0_1_ = 0x29;
  std::__ostream_insert<char,std::char_traits<char>>(this_00->os,(char *)&type_local,1);
  return;
}

Assistant:

std::ostream& TypePrinter::print(const Signature& sig) {
  auto printPrefixed = [&](const char* prefix, Type type) {
    os << '(' << prefix;
    for (Type t : type) {
      os << ' ';
      print(t);
    }
    os << ')';
  };

  os << "(func";
  if (sig.params.getID() != Type::none) {
    os << ' ';
    printPrefixed("param", sig.params);
  }
  if (sig.results.getID() != Type::none) {
    os << ' ';
    printPrefixed("result", sig.results);
  }
  return os << ')';
}